

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Mat6x6d * __thiscall OpenMD::HydroProp::getS(Mat6x6d *__return_storage_ptr__,HydroProp *this)

{
  if (this->hasS_ == false) {
    complete(this);
  }
  RectMatrix<double,_6U,_6U>::operator=
            (&__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>,
             &(this->S_).super_RectMatrix<double,_6U,_6U>);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getS() {
    if (!hasS_) { complete(); }
    return S_;
  }